

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O3

Vec_Ptr_t * Abc_NtkComputeSupportsSmart(Abc_Ntk_t *pNtk)

{
  char *pcVar1;
  undefined4 uVar2;
  Abc_Obj_t *pAVar3;
  int *piVar4;
  Supp_One_t *p1;
  void *pvVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  Supp_Man_t *p;
  Vec_Ptr_t *pVVar9;
  void **ppvVar10;
  Vec_Ptr_t *__ptr;
  Abc_Obj_t *pAVar11;
  Vec_Int_t *p_00;
  int iVar12;
  int iVar13;
  long lVar14;
  Supp_One_t *p_01;
  ulong local_48;
  
  lVar8 = (long)pNtk->vCis->nSize;
  if (0 < lVar8) {
    ppvVar10 = pNtk->vCis->pArray;
    lVar14 = 0;
    do {
      *(long *)((long)ppvVar10[lVar14] + 8) = lVar14;
      lVar14 = lVar14 + 1;
    } while (lVar8 != lVar14);
  }
  lVar8 = (long)pNtk->vCos->nSize;
  if (0 < lVar8) {
    ppvVar10 = pNtk->vCos->pArray;
    lVar14 = 0;
    do {
      *(long *)((long)ppvVar10[lVar14] + 8) = lVar14;
      lVar14 = lVar14 + 1;
    } while (lVar8 != lVar14);
  }
  p = Supp_ManStart(0x100000,0x40);
  uVar6 = pNtk->vCos->nSize;
  pVVar9 = (Vec_Ptr_t *)malloc(0x10);
  local_48 = 8;
  if (6 < uVar6 - 1) {
    local_48 = (ulong)uVar6;
  }
  pVVar9->nSize = 0;
  iVar12 = (int)local_48;
  pVVar9->nCap = iVar12;
  if (iVar12 == 0) {
    ppvVar10 = (void **)0x0;
  }
  else {
    ppvVar10 = (void **)malloc((long)iVar12 << 3);
  }
  pVVar9->pArray = ppvVar10;
  Abc_NtkCleanCopy(pNtk);
  __ptr = Abc_NtkDfsNatural(pNtk);
  iVar12 = __ptr->nSize;
  if (0 < (long)iVar12) {
    iVar13 = 0;
    lVar8 = 0;
    do {
      pAVar3 = (Abc_Obj_t *)__ptr->pArray[lVar8];
      uVar6 = *(uint *)&pAVar3->field_0x14 & 0xf;
      if (uVar6 == 7) {
        piVar4 = (pAVar3->vFanins).pArray;
        ppvVar10 = pAVar3->pNtk->vObjs->pArray;
        p1 = *(Supp_One_t **)((long)ppvVar10[*piVar4] + 0x40);
        p_01 = *(Supp_One_t **)((long)ppvVar10[piVar4[1]] + 0x40);
        pAVar11 = (Abc_Obj_t *)Supp_ManMergeEntry(p,p1,p_01,(pAVar3->vFanouts).nSize);
        (pAVar3->field_6).pCopy = pAVar11;
        if (p1->nRefs < 1) {
          __assert_fail("pPart0->nRefs > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcPart.c"
                        ,0x15a,"Vec_Ptr_t *Abc_NtkComputeSupportsSmart(Abc_Ntk_t *)");
        }
        iVar7 = p1->nRefs + -1;
        p1->nRefs = iVar7;
        if (iVar7 == 0) {
          iVar7 = p1->nOutsAlloc;
          if (iVar7 < p1->nOuts) goto LAB_002deccb;
          if (p1->nOuts < iVar7 / 2) goto LAB_002decea;
          Supp_ManRecycle(p,(char *)p1,iVar7 * 4 + 0xc);
        }
        iVar7 = p_01->nRefs;
        if (iVar7 < 1) {
          __assert_fail("pPart1->nRefs > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcPart.c"
                        ,0x15d,"Vec_Ptr_t *Abc_NtkComputeSupportsSmart(Abc_Ntk_t *)");
        }
LAB_002deba2:
        p_01->nRefs = iVar7 + -1;
        if (iVar7 + -1 == 0) {
          iVar7 = p_01->nOutsAlloc;
          if (iVar7 < p_01->nOuts) {
LAB_002deccb:
            __assert_fail("pEntry->nOuts <= pEntry->nOutsAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcPart.c"
                          ,0xc4,"void Supp_ManRecycleEntry(Supp_Man_t *, Supp_One_t *)");
          }
          if (p_01->nOuts < iVar7 / 2) {
LAB_002decea:
            __assert_fail("pEntry->nOuts >= pEntry->nOutsAlloc/2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcPart.c"
                          ,0xc5,"void Supp_ManRecycleEntry(Supp_Man_t *, Supp_One_t *)");
          }
          Supp_ManRecycle(p,(char *)p_01,iVar7 * 4 + 0xc);
        }
      }
      else {
        if (0xfffffffd < uVar6 - 5) {
          pvVar5 = pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray];
          p_01 = *(Supp_One_t **)((long)pvVar5 + 0x40);
          if ((*(uint *)((long)pvVar5 + 0x14) & 0xf) == 7) {
            p_00 = Supp_ManTransferEntry(p_01);
            Vec_IntPush(p_00,*(int *)&pAVar3->pNext);
            iVar7 = (int)local_48;
            if (iVar13 == iVar7) {
              if (iVar7 < 0x10) {
                if (pVVar9->pArray == (void **)0x0) {
                  ppvVar10 = (void **)malloc(0x80);
                }
                else {
                  ppvVar10 = (void **)realloc(pVVar9->pArray,0x80);
                }
                pVVar9->pArray = ppvVar10;
                pVVar9->nCap = 0x10;
                local_48 = 0x10;
              }
              else {
                local_48 = (ulong)(uint)(iVar7 * 2);
                if (pVVar9->pArray == (void **)0x0) {
                  ppvVar10 = (void **)malloc(local_48 * 8);
                }
                else {
                  ppvVar10 = (void **)realloc(pVVar9->pArray,local_48 * 8);
                }
                pVVar9->pArray = ppvVar10;
                pVVar9->nCap = iVar7 * 2;
              }
            }
            else {
              ppvVar10 = pVVar9->pArray;
            }
            lVar14 = (long)iVar13;
            iVar13 = iVar13 + 1;
            pVVar9->nSize = iVar13;
            ppvVar10[lVar14] = p_00;
          }
          iVar7 = p_01->nRefs;
          if (iVar7 < 1) {
            __assert_fail("pPart0->nRefs > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcPart.c"
                          ,0x16c,"Vec_Ptr_t *Abc_NtkComputeSupportsSmart(Abc_Ntk_t *)");
          }
          goto LAB_002deba2;
        }
        if ((uVar6 == 5) || (uVar6 == 2)) {
          iVar7 = (pAVar3->vFanouts).nSize;
          if (iVar7 != 0) {
            pAVar11 = (Abc_Obj_t *)Supp_ManFetch(p,0x10);
            *(int *)&pAVar11->pNtk = iVar7;
            *(undefined4 *)&pAVar11->pNext = 1;
            uVar2 = *(undefined4 *)&pAVar3->pNext;
            pcVar1 = (char *)((long)&pAVar11->pNtk + 4);
            pcVar1[0] = '\x01';
            pcVar1[1] = '\0';
            pcVar1[2] = '\0';
            pcVar1[3] = '\0';
            *(undefined4 *)((long)&pAVar11->pNext + 4) = uVar2;
LAB_002deb09:
            (pAVar3->field_6).pCopy = pAVar11;
          }
        }
        else {
          pAVar11 = Abc_AigConst1(pNtk);
          if (pAVar3 != pAVar11) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcPart.c"
                          ,0x181,"Vec_Ptr_t *Abc_NtkComputeSupportsSmart(Abc_Ntk_t *)");
          }
          iVar7 = (pAVar3->vFanouts).nSize;
          if (iVar7 != 0) {
            pAVar11 = (Abc_Obj_t *)Supp_ManFetch(p,0xc);
            *(int *)&pAVar11->pNtk = iVar7;
            *(undefined8 *)((long)&pAVar11->pNtk + 4) = 0;
            goto LAB_002deb09;
          }
        }
      }
      lVar8 = lVar8 + 1;
    } while (iVar12 != lVar8);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  Supp_ManStop(p);
  qsort(pVVar9->pArray,(long)pVVar9->nSize,8,Vec_VecSortCompare2);
  lVar8 = (long)pNtk->vCis->nSize;
  if (0 < lVar8) {
    ppvVar10 = pNtk->vCis->pArray;
    lVar14 = 0;
    do {
      *(undefined8 *)((long)ppvVar10[lVar14] + 8) = 0;
      lVar14 = lVar14 + 1;
    } while (lVar8 != lVar14);
  }
  lVar8 = (long)pNtk->vCos->nSize;
  if (0 < lVar8) {
    ppvVar10 = pNtk->vCos->pArray;
    lVar14 = 0;
    do {
      *(undefined8 *)((long)ppvVar10[lVar14] + 8) = 0;
      lVar14 = lVar14 + 1;
    } while (lVar8 != lVar14);
  }
  return pVVar9;
}

Assistant:

Vec_Ptr_t * Abc_NtkComputeSupportsSmart( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vSupports;
    Vec_Ptr_t * vNodes;
    Vec_Int_t * vSupp;
    Supp_Man_t * p;
    Supp_One_t * pPart0, * pPart1;
    Abc_Obj_t * pObj;
    int i;
    // set the number of PIs/POs
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pNext = (Abc_Obj_t *)(ABC_PTRINT_T)i;
    Abc_NtkForEachCo( pNtk, pObj, i )
        pObj->pNext = (Abc_Obj_t *)(ABC_PTRINT_T)i;
    // start the support computation manager
    p = Supp_ManStart( 1 << 20, 1 << 6 );
    // consider objects in the topological order
    vSupports = Vec_PtrAlloc( Abc_NtkCoNum(pNtk) );
    Abc_NtkCleanCopy(pNtk);
    // order the nodes so that the PIs and POs follow naturally
    vNodes = Abc_NtkDfsNatural( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        if ( Abc_ObjIsNode(pObj) )
        {
            pPart0 = (Supp_One_t *)Abc_ObjFanin0(pObj)->pCopy;
            pPart1 = (Supp_One_t *)Abc_ObjFanin1(pObj)->pCopy;
            pObj->pCopy = (Abc_Obj_t *)Supp_ManMergeEntry( p, pPart0, pPart1, Abc_ObjFanoutNum(pObj) );
            assert( pPart0->nRefs > 0 );
            if ( --pPart0->nRefs == 0 )
                Supp_ManRecycleEntry( p, pPart0 );
            assert( pPart1->nRefs > 0 );
            if ( --pPart1->nRefs == 0 )
                Supp_ManRecycleEntry( p, pPart1 );
            continue;
        }
        if ( Abc_ObjIsCo(pObj) )
        {
            pPart0 = (Supp_One_t *)Abc_ObjFanin0(pObj)->pCopy;
            // only save the CO if it is non-trivial
            if ( Abc_ObjIsNode(Abc_ObjFanin0(pObj)) )
            {
                vSupp = Supp_ManTransferEntry(pPart0);
                Vec_IntPush( vSupp, (int)(ABC_PTRINT_T)pObj->pNext );
                Vec_PtrPush( vSupports, vSupp );
            }
            assert( pPart0->nRefs > 0 );
            if ( --pPart0->nRefs == 0 )
                Supp_ManRecycleEntry( p, pPart0 );
            continue;
        }
        if ( Abc_ObjIsCi(pObj) )
        {
            if ( Abc_ObjFanoutNum(pObj) )
            {
                pPart0 = (Supp_One_t *)Supp_ManFetchEntry( p, 1, Abc_ObjFanoutNum(pObj) );
                pPart0->pOuts[ pPart0->nOuts++ ] = (int)(ABC_PTRINT_T)pObj->pNext;
                pObj->pCopy = (Abc_Obj_t *)pPart0;
            }
            continue;
        }
        if ( pObj == Abc_AigConst1(pNtk) )
        {
            if ( Abc_ObjFanoutNum(pObj) )
                pObj->pCopy = (Abc_Obj_t *)Supp_ManFetchEntry( p, 0, Abc_ObjFanoutNum(pObj) );
            continue;
        }
        assert( 0 );
    }
    Vec_PtrFree( vNodes );
//printf( "Memory usage = %d MB.\n", Vec_PtrSize(p->vMemory) * p->nChunkSize / (1<<20) );
    Supp_ManStop( p );
    // sort supports by size
    Vec_VecSort( (Vec_Vec_t *)vSupports, 1 );
    // clear the number of PIs/POs
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pNext = NULL;
    Abc_NtkForEachCo( pNtk, pObj, i )
        pObj->pNext = NULL;
/*
    Vec_PtrForEachEntry( Vec_Int_t *, vSupports, vSupp, i )
        printf( "%d ", Vec_IntSize(vSupp) );
    printf( "\n" );
*/
    return vSupports;
}